

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sws.c
# Opt level: O0

void nn_msg_array_term(nn_list *msg_array)

{
  int iVar1;
  msg_chunk *it_00;
  nn_list *in_RDI;
  msg_chunk *ch;
  nn_list_item *it;
  nn_list *in_stack_ffffffffffffffd8;
  
  while (iVar1 = nn_list_empty(in_RDI), iVar1 == 0) {
    it_00 = (msg_chunk *)nn_list_begin(in_RDI);
    if (it_00 == (msg_chunk *)0x0) {
      it_00 = (msg_chunk *)0x0;
    }
    nn_msg_chunk_term(it_00,in_stack_ffffffffffffffd8);
  }
  nn_list_term((nn_list *)0x159cd2);
  return;
}

Assistant:

void nn_msg_array_term (struct nn_list *msg_array)
{
    struct nn_list_item *it;
    struct msg_chunk *ch;

    while (!nn_list_empty (msg_array)) {
        it = nn_list_begin (msg_array);
        ch = nn_cont (it, struct msg_chunk, item);
        nn_msg_chunk_term (ch, msg_array);
    }

    nn_list_term (msg_array);
}